

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.h
# Opt level: O0

void __thiscall
TPZFYsmpMatrix<std::complex<float>_>::SetData
          (TPZFYsmpMatrix<std::complex<float>_> *this,int64_t *IA,int64_t *JA,complex<float> *A)

{
  int64_t iVar1;
  long *plVar2;
  complex<float> *__dest;
  TPZFYsmpMatrix<std::complex<float>_> *in_RCX;
  void *in_RDX;
  void *in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t nval;
  int nel;
  int __c;
  TPZVec<long> *in_stack_ffffffffffffffd0;
  TPZVec<std::complex<float>_> *this_00;
  
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  TPZVec<long>::resize(in_stack_ffffffffffffffd0,(int64_t)in_RDI);
  plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 1),0);
  memccpy(plVar2,in_RSI,(int)iVar1 + 1,8);
  plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 1),(long)(int)iVar1);
  this_00 = (TPZVec<std::complex<float>_> *)*plVar2;
  TPZVec<long>::resize((TPZVec<long> *)this_00,(int64_t)in_RDI);
  plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 2),0);
  memccpy(plVar2,in_RDX,(int)this_00,8);
  TPZVec<std::complex<float>_>::resize(this_00,(int64_t)in_RDI);
  __c = (int)this_00;
  __dest = TPZVec<std::complex<float>_>::operator[]((TPZVec<std::complex<float>_> *)(in_RDI + 3),0);
  memccpy(__dest,in_RCX,__c,8);
  ComputeDiagonal(in_RCX);
  return;
}

Assistant:

inline void TPZFYsmpMatrix<TVar>::SetData( int64_t *IA, int64_t *JA, TVar *A ) {
	// Pass the data to the class.
    int nel = this->Rows()+1;
    fIA.resize(nel);
    memccpy(&fIA[0], IA, nel, sizeof(int64_t));
    int64_t nval = fIA[nel-1];
    fJA.resize(nval);
    memccpy(&fJA[0], JA, nval, sizeof(int64_t));
    fA.resize(nval);
    memccpy(&fA[0], A, nval, sizeof(TVar));
	ComputeDiagonal();
}